

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fb.h
# Opt level: O0

_Bool fb_urange_iter(fb_group_t *fb,size_t nbits,size_t start,size_t *r_begin,size_t *r_len)

{
  uint uVar1;
  ulong *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long *in_R8;
  ssize_t next_range_end;
  ssize_t next_range_begin;
  size_t pos_1;
  size_t bit_1;
  ssize_t group_ind_bound_1;
  fb_group_t group_1;
  fb_group_t maybe_invert_1;
  size_t bit_ind_1;
  ssize_t group_ind_1;
  size_t ngroups_1;
  size_t pos;
  size_t bit;
  ssize_t group_ind_bound;
  fb_group_t group;
  fb_group_t maybe_invert;
  size_t bit_ind;
  ssize_t group_ind;
  size_t ngroups;
  _Bool local_d1;
  ulong local_b8;
  ulong local_a0;
  ulong local_70;
  ulong local_50;
  ulong local_38;
  ulong local_8;
  
  local_38 = in_RDX >> 6;
  local_50 = ((1L << ((byte)in_RDX & 0x3f)) - 1U ^ 0xffffffffffffffff) &
             (*(ulong *)(in_RDI + local_38 * 8) ^ 0xffffffffffffffff);
  while (local_50 == 0) {
    local_38 = local_38 + 1;
    local_8 = in_RSI;
    if (local_38 == (in_RSI >> 6) + (long)(int)(uint)((in_RSI & 0x3f) != 0)) goto LAB_02535c7a;
    local_50 = *(ulong *)(in_RDI + local_38 * 8) ^ 0xffffffffffffffff;
  }
  uVar1 = ffs_lu(local_50);
  local_8 = local_38 * 0x40 + (ulong)uVar1;
  if (in_RSI < local_8) {
    local_8 = in_RSI;
  }
LAB_02535c7a:
  if (local_8 == in_RSI) {
    local_d1 = false;
  }
  else {
    local_a0 = local_8 >> 6;
    local_b8 = ((1L << ((byte)local_8 & 0x3f)) - 1U ^ 0xffffffffffffffff) &
               *(ulong *)(in_RDI + local_a0 * 8);
    while (local_b8 == 0) {
      local_a0 = local_a0 + 1;
      local_70 = in_RSI;
      if (local_a0 == (in_RSI >> 6) + (long)(int)(uint)((in_RSI & 0x3f) != 0)) goto LAB_02535f9b;
      local_b8 = *(unsigned_long *)(in_RDI + local_a0 * 8);
    }
    uVar1 = ffs_lu(local_b8);
    local_70 = local_a0 * 0x40 + (ulong)uVar1;
LAB_02535f9b:
    *in_RCX = local_8;
    *in_R8 = local_70 - local_8;
    local_d1 = true;
  }
  return local_d1;
}

Assistant:

static inline bool
fb_urange_iter(fb_group_t *fb, size_t nbits, size_t start, size_t *r_begin,
    size_t *r_len) {
	return fb_iter_range_impl(fb, nbits, start, r_begin, r_len,
	    /* val */ false, /* forward */ true);
}